

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O3

int drmp3dec_decode_frame
              (drmp3dec *dec,uchar *mp3,int mp3_bytes,void *pcm,drmp3dec_frame_info *info)

{
  long *plVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  ushort uVar6;
  short sVar7;
  short sVar8;
  undefined2 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  drmp3d_sample_t *pdVar40;
  drmp3dec_frame_info *pdVar41;
  byte bVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  drmp3_uint32 dVar48;
  uint uVar49;
  drmp3_uint32 dVar50;
  drmp3_uint32 dVar51;
  long lVar52;
  uchar *puVar53;
  long lVar54;
  uint *puVar55;
  undefined8 uVar56;
  byte bVar57;
  byte bVar58;
  uint uVar59;
  uint uVar60;
  long lVar61;
  float *pfVar62;
  float *pfVar63;
  char cVar64;
  uint uVar65;
  float *pfVar66;
  uint uVar67;
  undefined1 *puVar68;
  int iVar69;
  ulong uVar70;
  uint uVar71;
  undefined1 *puVar72;
  undefined4 *puVar73;
  float *pfVar74;
  bool bVar75;
  uint uVar76;
  float *pfVar77;
  float *pfVar78;
  float (*overlap) [288];
  byte bVar79;
  uint uVar80;
  drmp3_uint8 *codebook_count1;
  ulong uVar81;
  uint uVar82;
  uint *puVar83;
  uint uVar84;
  uint uVar85;
  ulong uVar86;
  int iVar87;
  byte *pbVar88;
  long *plVar89;
  byte bVar90;
  bool bVar91;
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  undefined1 in_XMM1 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar96;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  drmp3_uint8 scf_size [4];
  drmp3_bs bs_frame [1];
  float tmp [18];
  drmp3dec_scratch scratch;
  ulong local_43f8;
  undefined1 *local_43e8;
  ulong local_43b8;
  byte local_439c [4];
  drmp3_bs local_4398;
  uchar *local_4388;
  uchar *local_4380;
  ulong local_4378;
  ulong local_4370;
  drmp3d_sample_t *local_4368;
  drmp3dec_frame_info *local_4360;
  float *local_4358;
  undefined4 local_434c;
  float *local_4348;
  drmp3_uint8 *local_4340;
  undefined4 local_4338;
  float fStack_4334;
  undefined4 local_4330;
  byte local_4038;
  byte local_4037;
  byte local_4036 [64];
  byte abStack_3ff6 [70];
  drmp3_bs local_3fb0;
  drmp3_uint8 local_3fa0 [2816];
  long local_34a0;
  ushort local_3498 [3];
  byte local_3492;
  undefined2 local_3491;
  byte local_348f [5];
  undefined2 local_348a;
  byte local_3488 [20];
  undefined2 auStack_3474 [42];
  float local_3420 [4];
  float afStack_3410 [572];
  undefined1 local_2b20 [16];
  float afStack_2b10 [572];
  float local_2220 [40];
  float local_2180 [2112];
  undefined1 local_80 [39];
  byte local_59 [41];
  
  bVar42 = 0;
  local_4368 = (drmp3d_sample_t *)pcm;
  local_4360 = info;
  if (mp3_bytes < 5) {
    uVar43 = 0;
    memset(dec,0,0x1a0c);
  }
  else {
    local_4380 = dec->header;
    local_4388 = mp3;
    if ((dec->header[0] == 0xff) && (iVar69 = drmp3_hdr_compare(local_4380,mp3), iVar69 != 0)) {
      bVar79 = local_4388[1];
      bVar58 = local_4388[2];
      iVar44 = drmp3_hdr_frame_bytes((drmp3_uint8 *)(ulong)bVar79,(uint)bVar58);
      uVar43 = 0;
      iVar69 = (uint)((~bVar79 & 6) == 0) * 3 + 1;
      if ((bVar58 & 2) == 0) {
        iVar69 = 0;
      }
      uVar59 = iVar69 + iVar44;
      local_43e8._0_4_ = mp3_bytes;
      if ((uVar59 == mp3_bytes) ||
         (((int)(uVar59 + 4) <= mp3_bytes &&
          (iVar69 = drmp3_hdr_compare(local_4388,local_4388 + (int)uVar59),
          local_43e8._0_4_ = uVar59, uVar59 != 0 && iVar69 != 0)))) {
LAB_001046e3:
        puVar53 = local_4388 + (int)uVar43;
        local_4398.buf = puVar53 + 4;
        *(undefined4 *)local_4380 = *(undefined4 *)puVar53;
        local_4360->frame_bytes = uVar43 + (uint)local_43e8;
        uVar59 = (puVar53[3] < 0xc0) + 1;
        local_4378 = (ulong)uVar59;
        local_4360->channels = uVar59;
        local_4360->hz =
             (*(uint *)(drmp3_hdr_sample_rate_hz_g_hz + (puVar53[2] & 0xc)) >>
             ((puVar53[1] & 8) == 0)) >> ((puVar53[1] & 0x10) == 0);
        uVar59 = puVar53[1] >> 1 & 3;
        local_4360->layer = 4 - uVar59;
        local_4360->bitrate_kbps =
             (uint)(byte)drmp3_hdr_bitrate_kbps_halfrate
                         [(ulong)(puVar53[2] >> 4) +
                          (long)(int)((puVar53[1] >> 1 & 3) - 1) * 0xf +
                          (ulong)(puVar53[1] >> 3 & 1) * 0x2d] * 2;
        local_4398.pos = 0;
        local_4398.limit = (uint)local_43e8 * 8 + -0x20;
        bVar79 = puVar53[1];
        if ((bVar79 & 1) == 0) {
          drmp3_bs_get_bits(&local_4398,0x10);
        }
        puVar53 = local_4388 + (int)uVar43;
        if ((char)uVar59 == '\x01') {
          iVar69 = ((bVar79 >> 3 & 1) + (uint)((bVar79 >> 4 & 1) != 0)) * 3 + (puVar53[2] >> 2 & 3);
          bVar58 = puVar53[3];
          dVar50 = 0;
          uVar43 = (bVar58 < 0xc0) + 1;
          local_4388 = puVar53;
          if ((bVar79 & 8) == 0) {
            dVar48 = drmp3_bs_get_bits(&local_4398,uVar43 | 8);
            uVar49 = dVar48 >> (sbyte)uVar43;
            uVar59 = uVar43;
          }
          else {
            uVar59 = uVar43 * 2;
            uVar49 = drmp3_bs_get_bits(&local_4398,9);
            dVar50 = drmp3_bs_get_bits(&local_4398,uVar43 * 2 + 7);
          }
          local_4370 = (ulong)(int)(iVar69 + -1 + (uint)(iVar69 == 0));
          lVar52 = local_4370 * 0x17;
          iVar69 = 0;
          pbVar88 = local_3488 + 7;
          do {
            uVar43 = dVar50 << 4;
            if (bVar58 < 0xc0) {
              uVar43 = dVar50;
            }
            uVar70 = (ulong)uVar43;
            dVar50 = drmp3_bs_get_bits(&local_4398,0xc);
            *(short *)(pbVar88 + -0x17) = (short)dVar50;
            dVar48 = drmp3_bs_get_bits(&local_4398,9);
            *(short *)(pbVar88 + -0x15) = (short)dVar48;
            if (0x120 < (dVar48 & 0xffff)) goto LAB_00104b77;
            dVar48 = drmp3_bs_get_bits(&local_4398,8);
            pbVar88[-0x11] = (byte)dVar48;
            dVar48 = drmp3_bs_get_bits(&local_4398,(uint)((bVar79 & 8) == 0) * 5 + 4);
            *(short *)(pbVar88 + -0x13) = (short)dVar48;
            *(undefined1 **)(pbVar88 + -0x1f) = drmp3_L3_read_side_info_g_scf_long + lVar52;
            pbVar88[-0xe] = 0x16;
            pbVar88[-0xd] = 0;
            dVar48 = drmp3_bs_get_bits(&local_4398,1);
            if (dVar48 == 0) {
              pbVar88[-0x10] = 0;
              pbVar88[-0xf] = 0;
              dVar48 = drmp3_bs_get_bits(&local_4398,0xf);
              dVar51 = drmp3_bs_get_bits(&local_4398,4);
              pbVar88[-9] = (byte)dVar51;
              dVar51 = drmp3_bs_get_bits(&local_4398,3);
              pbVar88[-8] = (byte)dVar51;
              pbVar88[-7] = 0xff;
            }
            else {
              dVar48 = drmp3_bs_get_bits(&local_4398,2);
              pbVar88[-0x10] = (byte)dVar48;
              if ((byte)dVar48 == 0) goto LAB_00104b77;
              dVar48 = drmp3_bs_get_bits(&local_4398,1);
              pbVar88[-0xf] = (byte)dVar48;
              pbVar88[-9] = 7;
              pbVar88[-8] = 0xff;
              if (pbVar88[-0x10] == 2) {
                bVar57 = 0x1e;
                puVar72 = drmp3_L3_read_side_info_g_scf_mixed;
                bVar90 = ((bVar79 & 8) >> 2) + 6;
                if ((byte)dVar48 == 0) {
                  pbVar88[-9] = 8;
                  bVar57 = 0x27;
                  bVar90 = 0;
                  puVar72 = drmp3_L3_read_side_info_g_scf_short;
                }
                uVar70 = (ulong)(uVar43 & 0xf0f);
                *(undefined1 **)(pbVar88 + -0x1f) = puVar72 + local_4370 * 0x28;
                pbVar88[-0xe] = bVar90;
                pbVar88[-0xd] = bVar57;
              }
              dVar48 = drmp3_bs_get_bits(&local_4398,10);
              dVar48 = dVar48 << 5;
              dVar51 = drmp3_bs_get_bits(&local_4398,3);
              pbVar88[-6] = (byte)dVar51;
              dVar51 = drmp3_bs_get_bits(&local_4398,3);
              pbVar88[-5] = (byte)dVar51;
              dVar51 = drmp3_bs_get_bits(&local_4398,3);
              pbVar88[-4] = (byte)dVar51;
            }
            pbVar88[-0xc] = (byte)(dVar48 >> 10);
            pbVar88[-0xb] = (byte)(dVar48 >> 5) & 0x1f;
            pbVar88[-10] = (byte)dVar48 & 0x1f;
            if ((bVar79 & 8) == 0) {
              bVar90 = 499 < *(ushort *)(pbVar88 + -0x13);
            }
            else {
              dVar48 = drmp3_bs_get_bits(&local_4398,1);
              bVar90 = (byte)dVar48;
            }
            iVar69 = iVar69 + (dVar50 & 0xffff);
            pbVar88[-3] = bVar90;
            dVar50 = drmp3_bs_get_bits(&local_4398,1);
            pbVar88[-2] = (byte)dVar50;
            dVar50 = drmp3_bs_get_bits(&local_4398,1);
            iVar44 = local_4398.pos;
            pbVar88[-1] = (byte)dVar50;
            *pbVar88 = (byte)(uVar70 >> 0xc) & 0xf;
            dVar50 = (int)uVar70 << 4;
            pbVar88 = pbVar88 + 0x20;
            uVar59 = uVar59 - 1;
          } while (uVar59 != 0);
          iVar45 = local_4398.limit - local_4398.pos;
          if ((local_4398.limit < local_4398.pos || (int)uVar49 < 0) ||
              (int)(local_4398.limit + uVar49 * 8) < iVar69 + local_4398.pos) {
LAB_00104b77:
            *local_4380 = '\0';
            return 0;
          }
          uVar43 = dec->reserv;
          uVar59 = uVar49;
          if ((int)uVar43 < (int)uVar49) {
            uVar59 = uVar43;
          }
          uVar80 = 0;
          uVar70 = (ulong)(uVar43 - uVar49);
          if ((int)(uVar43 - uVar49) < 1) {
            uVar70 = 0;
          }
          iVar69 = iVar45 + 7;
          if (-1 < iVar45) {
            iVar69 = iVar45;
          }
          memcpy(local_3fa0,dec->reserv_buf + uVar70,(long)(int)uVar59);
          iVar45 = iVar44 + 7;
          if (-1 < iVar44) {
            iVar45 = iVar44;
          }
          memcpy(local_3fa0 + (int)uVar59,local_4398.buf + (iVar45 >> 3),(long)(iVar69 >> 3));
          local_3fb0.pos = 0;
          local_3fb0.limit = ((iVar69 >> 3) + uVar59) * 8;
          local_3fb0.buf = local_3fa0;
          if ((local_4368 != (drmp3d_sample_t *)0x0) && ((int)uVar49 <= (int)uVar43)) {
            local_4348 = dec->qmf_state;
            iVar69 = 0;
            uVar56 = CONCAT71((int7)((ulong)local_4348 >> 8),1);
            uVar70 = local_4378;
            do {
              local_434c = (undefined4)uVar56;
              memset(local_3420,0,0x1200);
              lVar52 = (long)(iVar69 * (int)uVar70);
              lVar61 = lVar52 * 0x20;
              plVar89 = &local_34a0 + lVar52 * 4;
              local_4358 = (float *)(uVar70 & 0xffffffff);
              local_4378 = uVar70;
              auVar124._0_12_ = ZEXT812(0x3f800000);
              auVar124._12_4_ = 0;
              if (0 < (int)uVar70) {
                local_43b8 = (ulong)(uint)local_3fb0.pos;
                puVar53 = (uchar *)0x0;
LAB_00104db0:
                puVar73 = &local_4338;
                lVar54 = (long)puVar53 * 0x20;
                plVar1 = plVar89 + (long)puVar53 * 4;
                uVar6 = local_3498[lVar52 * 0x10 + (long)puVar53 * 0x10];
                local_43e8 = drmp3_L3_decode_scalefactors_g_scf_partitions +
                             (((ulong)(local_348f[lVar54 + lVar61] == 0) + 1) -
                             (ulong)(local_348f[lVar54 + lVar61 + 1] == 0)) * 0x1c;
                bVar79 = local_3488[lVar54 + lVar61 + 5];
                if ((dec->header[1] & 8) == 0) {
                  bVar58 = (dec->header[3] & 0x10) >> 4 & puVar53 != (uchar *)0x0;
                  uVar59 = (uint)(*(ushort *)((long)plVar1 + 0xc) >> bVar58);
                  uVar70 = 0;
                  if (bVar58 != 0) {
                    uVar70 = 0xc;
                  }
                  puVar72 = drmp3_L3_decode_scalefactors_g_mod + uVar70;
                  do {
                    uVar81 = 1;
                    lVar54 = 3;
                    do {
                      bVar58 = puVar72[lVar54];
                      local_439c[lVar54] = (byte)((uVar59 / uVar81) % (ulong)bVar58);
                      uVar80 = (int)uVar81 * (uint)bVar58;
                      uVar81 = (ulong)uVar80;
                      bVar91 = lVar54 != 0;
                      lVar54 = lVar54 + -1;
                    } while (bVar91);
                    uVar70 = uVar70 + 4;
                    puVar72 = puVar72 + 4;
                    uVar59 = uVar59 - uVar80;
                  } while (-1 < (int)uVar59);
                  local_43e8 = local_43e8 + (uVar70 & 0xffffffff);
                  uVar59 = 0xfffffff0;
                }
                else {
                  uVar59 = (uint)*(byte *)((long)plVar1 + 0x1f);
                  local_439c[0] =
                       (byte)drmp3_L3_decode_scalefactors_g_scfc_decode
                             [*(ushort *)((long)plVar1 + 0xc)] >> 2;
                  local_439c[1] = local_439c[0];
                  local_439c[2] =
                       drmp3_L3_decode_scalefactors_g_scfc_decode[*(ushort *)((long)plVar1 + 0xc)] &
                       3;
                  local_439c[3] = local_439c[2];
                }
                local_43b8 = (long)(int)local_43b8 + (ulong)uVar6;
                local_4380 = puVar53;
                puVar72 = local_80 + (long)puVar53 * 0x27;
                lVar54 = 0;
                do {
                  uVar70 = (ulong)(byte)local_43e8[lVar54];
                  if (uVar70 == 0) break;
                  if ((uVar59 & 8) == 0) {
                    bVar58 = local_439c[lVar54];
                    if (bVar58 == 0) {
                      memset(puVar73,0,uVar70);
                      memset(puVar72,0,uVar70);
                    }
                    else {
                      dVar50 = ~(-1 << (bVar58 & 0x1f));
                      if (-1 < (int)uVar59) {
                        dVar50 = 0xffffffff;
                      }
                      uVar81 = 0;
                      do {
                        dVar51 = drmp3_bs_get_bits(&local_3fb0,(uint)bVar58);
                        dVar48 = dVar51;
                        if (dVar51 == dVar50) {
                          dVar48 = 0xff;
                        }
                        *(char *)((long)puVar73 + uVar81) = (char)dVar51;
                        puVar72[uVar81] = (char)dVar48;
                        uVar81 = uVar81 + 1;
                      } while (uVar70 != uVar81);
                    }
                  }
                  else {
                    memcpy(puVar73,puVar72,uVar70);
                  }
                  puVar72 = puVar72 + uVar70;
                  puVar73 = (undefined4 *)((long)puVar73 + uVar70);
                  lVar54 = lVar54 + 1;
                  uVar59 = uVar59 * 2;
                  auVar124._0_12_ = ZEXT812(0x3f800000);
                  auVar124._12_4_ = 0;
                } while (lVar54 != 4);
                *(undefined1 *)((long)puVar73 + 2) = 0;
                *(undefined2 *)puVar73 = 0;
                bVar58 = *(byte *)((long)plVar1 + 0x12);
                if ((ulong)bVar58 == 0) {
                  if (*(char *)((long)plVar1 + 0x1c) != '\0') {
                    lVar54 = 0;
                    do {
                      pcVar2 = (char *)((long)&local_4330 + lVar54 + 3);
                      *pcVar2 = *pcVar2 + (&drmp3_L3_decode_scalefactors_g_preamp)[lVar54];
                      lVar54 = lVar54 + 1;
                    } while (lVar54 != 10);
                  }
                }
                else {
                  cVar3 = *(char *)((long)plVar1 + 0x19);
                  bVar90 = 2 - bVar79;
                  cVar64 = *(char *)((long)plVar1 + 0x1a);
                  uVar81 = (ulong)*(byte *)((long)plVar1 + 0x11);
                  cVar4 = *(char *)((long)plVar1 + 0x1b);
                  uVar70 = 0;
                  do {
                    pcVar2 = (char *)((long)&local_4338 + uVar70 + uVar81);
                    *pcVar2 = *pcVar2 + (cVar3 << (bVar90 & 0x1f));
                    pcVar2 = (char *)((long)&local_4338 + uVar70 + uVar81 + 1);
                    *pcVar2 = *pcVar2 + (cVar64 << (bVar90 & 0x1f));
                    pcVar2 = (char *)((long)&local_4338 + uVar70 + uVar81 + 2);
                    *pcVar2 = *pcVar2 + (cVar4 << (bVar90 & 0x1f));
                    uVar70 = uVar70 + 3;
                  } while (uVar70 < bVar58);
                }
                fVar92 = 2048.0;
                uVar59 = ((uint)((dec->header[3] & 0xe0) == 0x60) * 2 -
                         (uint)*(byte *)((long)plVar1 + 0xe)) + 0x102;
                do {
                  uVar80 = 0x78;
                  if (uVar59 < 0x78) {
                    uVar80 = uVar59;
                  }
                  fVar92 = fVar92 * (float)(int)(0x40000000 >> ((byte)(uVar80 >> 2) & 0x1f)) *
                                    (float)(&drmp3_L3_ldexp_q2_g_expfrac)[uVar80 & 3];
                  uVar65 = uVar59 - uVar80;
                  bVar91 = (int)uVar80 <= (int)uVar59;
                  uVar59 = uVar65;
                } while (uVar65 != 0 && bVar91);
                uVar59 = (uint)bVar58 + (uint)*(byte *)((long)plVar1 + 0x11);
                if (uVar59 != 0) {
                  uVar70 = 0;
                  do {
                    uVar80 = (uint)*(byte *)((long)&local_4338 + uVar70) << (bVar79 + 1 & 0x1f);
                    fVar95 = fVar92;
                    do {
                      uVar65 = 0x78;
                      if ((int)uVar80 < 0x78) {
                        uVar65 = uVar80;
                      }
                      fVar95 = fVar95 * (float)(int)(0x40000000 >> ((byte)(uVar65 >> 2) & 0x1f)) *
                                        (float)(&drmp3_L3_ldexp_q2_g_expfrac)[uVar65 & 3];
                      uVar71 = uVar80 - uVar65;
                      bVar91 = (int)uVar65 <= (int)uVar80;
                      uVar80 = uVar71;
                    } while (uVar71 != 0 && bVar91);
                    local_2220[uVar70] = fVar95;
                    uVar70 = uVar70 + 1;
                  } while (uVar70 != uVar59);
                }
                pfVar63 = local_3420 + (long)local_4380 * 0x240;
                uVar59 = local_3fb0.pos + 7;
                if (-1 < local_3fb0.pos) {
                  uVar59 = local_3fb0.pos;
                }
                puVar83 = (uint *)((long)(local_3fb0.buf + ((int)uVar59 >> 3)) + 4);
                uVar59 = *(uint *)(local_3fb0.buf + ((int)uVar59 >> 3));
                uVar70 = (ulong)((uVar59 >> 0x18 | (uVar59 & 0xff0000) >> 8 | (uVar59 & 0xff00) << 8
                                 | uVar59 << 0x18) << ((byte)local_3fb0.pos & 7));
                uVar59 = local_3fb0.pos | 0xfffffff8;
                pbVar88 = (byte *)*plVar1;
                if (*(ushort *)((long)plVar1 + 10) == 0) {
                  auVar93._0_12_ = ZEXT812(0);
                  auVar93._12_4_ = 0;
                  uVar80 = 1;
                  pfVar77 = local_2220;
                }
                else {
                  local_4340 = local_3fb0.buf;
                  lVar54 = 0;
                  pfVar77 = local_2220;
                  uVar80 = (uint)*(ushort *)((long)plVar1 + 10);
                  do {
                    bVar79 = *(byte *)((long)plVar1 + lVar54 + 0x13);
                    local_4370 = lVar54;
                    sVar7 = *(short *)(drmp3_L3_huffman_tabindex + (ulong)bVar79 * 2);
                    bVar58 = drmp3_L3_huffman_g_linbits[bVar79];
                    uVar71 = uVar80;
                    uVar65 = (uint)*(byte *)((long)plVar1 + lVar54 + 0x16);
                    do {
                      uVar60 = (uint)(*pbVar88 >> 1);
                      uVar80 = uVar60;
                      if (uVar71 < uVar60) {
                        uVar80 = uVar71;
                      }
                      fVar92 = *pfVar77;
                      auVar93 = ZEXT416((uint)fVar92);
                      do {
                        uVar82 = (uint)uVar70;
                        sVar8 = *(short *)(drmp3_L3_huffman_tabs +
                                          (uVar70 >> 0x1b) * 2 + (long)sVar7 * 2);
                        uVar85 = (uint)sVar8;
                        if (sVar8 < 0) {
                          uVar76 = 5;
                          do {
                            uVar82 = (int)uVar70 << (sbyte)uVar76;
                            uVar70 = (ulong)uVar82;
                            uVar59 = uVar59 + uVar76;
                            uVar76 = uVar85 & 7;
                            sVar8 = *(short *)(drmp3_L3_huffman_tabs +
                                              (ulong)((uVar82 >> (-(char)uVar76 & 0x1fU)) -
                                                     ((int)uVar85 >> 3)) * 2 + (long)sVar7 * 2);
                            uVar85 = (uint)sVar8;
                          } while (sVar8 < 0);
                        }
                        uVar70 = (ulong)(uVar82 << ((byte)(uVar85 >> 8) & 0x1f));
                        uVar59 = (uVar85 >> 8) + uVar59;
                        bVar91 = true;
                        do {
                          bVar75 = bVar91;
                          uVar82 = uVar85 & 0xf;
                          uVar76 = (uint)uVar70;
                          if (((bVar79 & 0xf0) == 0x10) && (uVar82 == 0xf)) {
                            uVar67 = uVar76 >> (0x20 - bVar58 & 0x1f);
                            uVar76 = uVar76 << (bVar58 & 0x1f);
                            uVar59 = uVar59 + bVar58;
                            uVar82 = uVar59;
                            if (-1 < (int)uVar59) {
                              do {
                                uVar59 = *puVar83;
                                puVar83 = (uint *)((long)puVar83 + 1);
                                uVar76 = uVar76 | (uint)(byte)uVar59 << ((byte)uVar82 & 0x1f);
                                uVar59 = uVar82 - 8;
                                bVar91 = 7 < uVar82;
                                uVar82 = uVar59;
                              } while (bVar91);
                            }
                            uVar82 = uVar67 + 0xf;
                            if ((int)uVar82 < 0x81) {
                              fVar95 = g_drmp3_pow43[(int)(uVar67 + 0x1f)];
                            }
                            else {
                              uVar67 = uVar82 * 8;
                              if (uVar82 >= 0x400) {
                                uVar67 = uVar82;
                              }
                              uVar84 = uVar67 * 2 & 0x40;
                              fVar95 = (float)(int)((uVar67 & 0x3f) - uVar84) /
                                       (float)(int)((uVar67 & 0x7fffffc0) + uVar84);
                              fVar95 = ((fVar95 * 0.22222222 + 1.3333334) * fVar95 + auVar124._0_4_)
                                       * g_drmp3_pow43[(ulong)(uVar84 + uVar67 >> 6) + 0x10] *
                                       *(float *)(&DAT_00112278 + (ulong)(uVar82 < 0x400) * 4);
                            }
                            fVar95 = (float)(int)((int)uVar76 >> 0x1f | 1) * fVar95 * fVar92;
                          }
                          else {
                            fVar95 = g_drmp3_pow43[((uint)(uVar70 >> 0x1b) & 0x10 | uVar82) ^ 0x10]
                                     * fVar92;
                          }
                          *pfVar63 = fVar95;
                          uVar70 = (ulong)(uVar76 << (uVar82 != 0));
                          uVar59 = uVar59 + (uVar82 != 0);
                          pfVar63 = pfVar63 + 1;
                          uVar85 = uVar85 >> 4;
                          bVar91 = false;
                        } while (bVar75);
                        uVar82 = uVar59;
                        if (-1 < (int)uVar59) {
                          do {
                            uVar59 = *puVar83;
                            puVar83 = (uint *)((long)puVar83 + 1);
                            uVar70 = (ulong)((uint)uVar70 |
                                            (uint)(byte)uVar59 << ((byte)uVar82 & 0x1f));
                            uVar59 = uVar82 - 8;
                            bVar91 = 7 < uVar82;
                            uVar82 = uVar59;
                          } while (bVar91);
                        }
                        uVar80 = uVar80 - 1;
                      } while (uVar80 != 0);
                      pbVar88 = pbVar88 + 1;
                      pfVar77 = pfVar77 + 1;
                      uVar80 = uVar71 - uVar60;
                    } while ((uVar80 != 0 && (int)uVar60 <= (int)uVar71) &&
                            (bVar91 = 0 < (int)uVar65, uVar71 = uVar80, uVar65 = uVar65 - 1, bVar91)
                            );
                    lVar54 = lVar54 + 1;
                  } while (0 < (int)uVar80);
                  uVar80 = 1 - uVar80;
                }
                puVar72 = drmp3_L3_huffman_tab33;
                if (*(char *)((long)plVar1 + 0x1e) == '\0') {
                  puVar72 = drmp3_L3_huffman_tab32;
                }
                do {
                  bVar79 = puVar72[uVar70 >> 0x1c];
                  if ((bVar79 & 8) == 0) {
                    bVar79 = puVar72[(ulong)((uint)((int)uVar70 << 4) >> (-(bVar79 & 3) & 0x1f)) +
                                     (ulong)(bVar79 >> 3)];
                  }
                  uVar71 = bVar79 & 7;
                  uVar65 = (int)uVar70 << (sbyte)uVar71;
                  uVar59 = uVar71 + uVar59;
                  if ((long)local_43b8 <
                      (long)(int)uVar59 + ((long)puVar83 - (long)local_3fb0.buf) * 8 + -0x18)
                  goto LAB_001055d0;
                  uVar80 = uVar80 - 1;
                  if (uVar80 == 0) {
                    bVar58 = *pbVar88;
                    if (bVar58 < 2) goto LAB_001055d0;
                    pbVar88 = pbVar88 + 1;
                    uVar80 = (uint)(bVar58 >> 1);
                    auVar93 = ZEXT416((uint)*pfVar77);
                    pfVar77 = pfVar77 + 1;
                  }
                  if (0x7f < bVar79) {
                    auVar97 = auVar93;
                    if ((int)uVar65 < 0) {
                      auVar97._0_4_ = auVar93._0_4_ ^ 0x80000000;
                      auVar97._4_4_ = 0;
                      auVar97._8_4_ = auVar93._8_4_ ^ 0x80000000;
                      auVar97._12_4_ = auVar93._12_4_ ^ 0x80000000;
                    }
                    *pfVar63 = auVar97._0_4_;
                    uVar65 = uVar65 * 2;
                    uVar59 = uVar59 + 1;
                  }
                  if ((bVar79 & 0x40) != 0) {
                    auVar98 = auVar93;
                    if ((int)uVar65 < 0) {
                      auVar98._0_4_ = auVar93._0_4_ ^ 0x80000000;
                      auVar98._4_4_ = 0;
                      auVar98._8_4_ = auVar93._8_4_ ^ 0x80000000;
                      auVar98._12_4_ = auVar93._12_4_ ^ 0x80000000;
                    }
                    pfVar63[1] = auVar98._0_4_;
                    uVar65 = uVar65 * 2;
                    uVar59 = uVar59 + 1;
                  }
                  uVar80 = uVar80 - 1;
                  if (uVar80 == 0) {
                    bVar58 = *pbVar88;
                    if (bVar58 < 2) goto LAB_001055d0;
                    pbVar88 = pbVar88 + 1;
                    uVar80 = (uint)(bVar58 >> 1);
                    auVar93 = ZEXT416((uint)*pfVar77);
                    pfVar77 = pfVar77 + 1;
                  }
                  if ((bVar79 & 0x20) != 0) {
                    auVar99 = auVar93;
                    if ((int)uVar65 < 0) {
                      auVar99._0_4_ = auVar93._0_4_ ^ 0x80000000;
                      auVar99._4_4_ = 0;
                      auVar99._8_4_ = auVar93._8_4_ ^ 0x80000000;
                      auVar99._12_4_ = auVar93._12_4_ ^ 0x80000000;
                    }
                    pfVar63[2] = auVar99._0_4_;
                    uVar65 = uVar65 * 2;
                    uVar59 = uVar59 + 1;
                  }
                  if ((bVar79 & 0x10) != 0) {
                    auVar100 = auVar93;
                    if ((int)uVar65 < 0) {
                      auVar100._0_4_ = auVar93._0_4_ ^ 0x80000000;
                      auVar100._4_4_ = 0;
                      auVar100._8_4_ = auVar93._8_4_ ^ 0x80000000;
                      auVar100._12_4_ = auVar93._12_4_ ^ 0x80000000;
                    }
                    pfVar63[3] = auVar100._0_4_;
                    uVar65 = uVar65 * 2;
                    uVar59 = uVar59 + 1;
                  }
                  uVar70 = (ulong)uVar65;
                  puVar55 = puVar83;
                  if (-1 < (int)uVar59) {
                    puVar55 = (uint *)((long)puVar83 + (ulong)(uVar59 >> 3) + 1);
                    uVar65 = uVar59;
                    do {
                      uVar71 = *puVar83;
                      puVar83 = (uint *)((long)puVar83 + 1);
                      uVar70 = (ulong)((uint)uVar70 | (uint)(byte)uVar71 << ((byte)uVar65 & 0x1f));
                      bVar91 = 7 < uVar65;
                      uVar65 = uVar65 - 8;
                    } while (bVar91);
                    uVar59 = (uVar59 & 0x80000007) - 8;
                  }
                  pfVar63 = pfVar63 + 4;
                  puVar83 = puVar55;
                } while( true );
              }
LAB_001055f5:
              bVar79 = dec->header[3];
              if ((bVar79 & 0x10) == 0) {
                if ((bVar79 & 0xe0) == 0x60) {
                  uVar70 = 0xfffffffffffffffc;
                  do {
                    fVar92 = afStack_3410[uVar70];
                    fVar95 = afStack_3410[uVar70 + 1];
                    fVar96 = afStack_3410[uVar70 + 2];
                    fVar31 = afStack_3410[uVar70 + 3];
                    auVar94 = *(undefined1 (*) [16])(afStack_2b10 + uVar70);
                    auVar113._0_4_ = fVar92 + auVar94._0_4_;
                    auVar113._4_4_ = fVar95 + auVar94._4_4_;
                    auVar113._8_4_ = fVar96 + auVar94._8_4_;
                    auVar113._12_4_ = fVar31 + auVar94._12_4_;
                    *(undefined1 (*) [16])(afStack_3410 + uVar70) = auVar113;
                    afStack_2b10[uVar70] = fVar92 - auVar94._0_4_;
                    afStack_2b10[uVar70 + 1] = fVar95 - auVar94._4_4_;
                    afStack_2b10[uVar70 + 2] = fVar96 - auVar94._8_4_;
                    local_2220[uVar70 - 0x239] = fVar31 - auVar94._12_4_;
                    uVar70 = uVar70 + 4;
                  } while (uVar70 < 0x239);
                }
              }
              else {
                bVar58 = local_348f[lVar61];
                bVar90 = local_348f[lVar61 + 1];
                lVar61 = *plVar89;
                local_4330 = -NAN;
                _local_4338 = 0xffffffffffffffff;
                uVar59 = (uint)bVar90 + (uint)bVar58;
                if (uVar59 != 0) {
                  uVar70 = 0;
                  puVar72 = local_2b20;
                  do {
                    uVar81 = (ulong)*(byte *)(lVar61 + uVar70);
                    if (uVar81 == 0) {
                      uVar81 = 0;
                    }
                    else {
                      uVar86 = 0;
                      do {
                        if (((*(float *)(puVar72 + uVar86 * 4) != 0.0) ||
                            (*(float *)(puVar72 + uVar86 * 4 + 4) != 0.0)) ||
                           (NAN(*(float *)(puVar72 + uVar86 * 4 + 4)))) {
                          (&local_4338)[(uint)((int)uVar70 + (int)((uVar70 & 0xffffffff) / 3) * -3)]
                               = (int)uVar70;
                          break;
                        }
                        uVar86 = uVar86 + 2;
                      } while (uVar86 < uVar81);
                    }
                    puVar72 = puVar72 + uVar81 * 4;
                    uVar70 = uVar70 + 1;
                  } while (uVar70 != uVar59);
                }
                if (bVar58 != 0) {
                  if ((int)fStack_4334 < (int)local_4338) {
                    fStack_4334 = local_4338;
                  }
                  if ((int)fStack_4334 <= (int)local_4330) {
                    fStack_4334 = local_4330;
                  }
                  local_4330 = fStack_4334;
                  _local_4338 = CONCAT44(fStack_4334,fStack_4334);
                }
                uVar80 = (uint)(bVar90 != 0) * 2 + 1;
                lVar61 = (long)(int)(uVar59 - uVar80) + -0x59;
                uVar70 = 0;
                do {
                  if ((int)(&local_4338)[uVar70] < (int)(uVar59 + uVar80 * -2 + (int)uVar70)) {
                    bVar58 = local_59[uVar70 + (lVar61 - (ulong)uVar80) + 0x59];
                  }
                  else {
                    bVar58 = (char)(dec->header[1] << 4) >> 7 & 3;
                  }
                  local_59[uVar70 + lVar61 + 0x59] = bVar58;
                  uVar70 = uVar70 + 1;
                } while (uVar70 != uVar80);
                pbVar88 = (byte *)*plVar89;
                bVar58 = dec->header[1];
                bVar90 = 7;
                if ((bVar58 & 8) == 0) {
                  bVar90 = 0x40;
                }
                bVar57 = *pbVar88;
                if (bVar57 != 0) {
                  uVar9 = auStack_3474[lVar52 * 0x10];
                  fVar92 = *(float *)(&DAT_00112280 + (ulong)((bVar79 & 0x20) == 0) * 4);
                  uVar70 = 0;
                  pfVar63 = local_3420;
                  do {
                    iVar69 = (int)uVar70;
                    if ((int)(&local_4338)[(uint)(iVar69 + (int)(uVar70 / 3) * -3)] < iVar69) {
                      bVar5 = local_59[uVar70];
                      if (bVar90 <= bVar5) goto LAB_001058ae;
                      if ((bVar58 & 8) == 0) {
                        auVar101 = auVar124;
                        uVar59 = (bVar5 + 1 >> 1) << ((byte)uVar9 & 1);
                        do {
                          auVar94 = auVar101;
                          uVar80 = 0x78;
                          if ((int)uVar59 < 0x78) {
                            uVar80 = uVar59;
                          }
                          auVar101._4_12_ = auVar94._4_12_;
                          auVar101._0_4_ =
                               auVar94._0_4_ *
                               (float)(int)(0x40000000 >> ((byte)(uVar80 >> 2) & 0x1f)) *
                               (float)(&drmp3_L3_ldexp_q2_g_expfrac)[uVar80 & 3];
                          uVar65 = uVar59 - uVar80;
                          bVar91 = (int)uVar80 <= (int)uVar59;
                          uVar59 = uVar65;
                        } while (uVar65 != 0 && bVar91);
                        auVar114 = auVar124;
                        if ((bVar5 & 1) != 0) {
                          auVar114._4_4_ = 0;
                          auVar114._0_4_ = auVar101._0_4_;
                          auVar114._8_4_ = auVar94._8_4_;
                          auVar114._12_4_ = auVar94._12_4_;
                          auVar101 = auVar124;
                        }
                        fVar96 = auVar101._0_4_;
                        fVar95 = auVar114._0_4_;
                      }
                      else {
                        fVar95 = *(float *)(drmp3_L3_stereo_process_g_pan + (ulong)bVar5 * 8);
                        fVar96 = *(float *)(drmp3_L3_stereo_process_g_pan + (ulong)bVar5 * 8 + 4);
                      }
                      uVar81 = 0;
                      do {
                        pfVar63[uVar81 + 0x240] = fVar96 * fVar92 * pfVar63[uVar81];
                        pfVar63[uVar81] = pfVar63[uVar81] * fVar95 * fVar92;
                        uVar81 = uVar81 + 1;
                      } while (bVar57 != uVar81);
                    }
                    else {
LAB_001058ae:
                      if ((bVar79 & 0x20) != 0) {
                        if (bVar57 < 4) {
                          uVar81 = 0;
                        }
                        else {
                          uVar81 = 0;
                          do {
                            pfVar77 = pfVar63 + uVar81;
                            fVar95 = *pfVar77;
                            fVar96 = pfVar77[1];
                            fVar31 = pfVar77[2];
                            fVar32 = pfVar77[3];
                            auVar94 = *(undefined1 (*) [16])(pfVar63 + uVar81 + 0x240);
                            pfVar77 = pfVar63 + uVar81;
                            *pfVar77 = fVar95 + auVar94._0_4_;
                            pfVar77[1] = fVar96 + auVar94._4_4_;
                            pfVar77[2] = fVar31 + auVar94._8_4_;
                            pfVar77[3] = fVar32 + auVar94._12_4_;
                            auVar102._0_4_ = fVar95 - auVar94._0_4_;
                            auVar102._4_4_ = fVar96 - auVar94._4_4_;
                            auVar102._8_4_ = fVar31 - auVar94._8_4_;
                            auVar102._12_4_ = fVar32 - auVar94._12_4_;
                            *(undefined1 (*) [16])(pfVar63 + uVar81 + 0x240) = auVar102;
                            uVar81 = uVar81 + 4;
                          } while (uVar81 < bVar57 - 3);
                          if ((int)(uint)bVar57 <= (int)uVar81) goto LAB_001059a2;
                        }
                        uVar81 = uVar81 & 0xffffffff;
                        do {
                          fVar95 = pfVar63[uVar81];
                          pfVar63[uVar81] = fVar95 + pfVar63[uVar81 + 0x240];
                          pfVar63[uVar81 + 0x240] = fVar95 - pfVar63[uVar81 + 0x240];
                          uVar81 = uVar81 + 1;
                        } while (bVar57 != uVar81);
                      }
                    }
LAB_001059a2:
                    pfVar63 = pfVar63 + pbVar88[uVar70];
                    uVar70 = (ulong)(iVar69 + 1);
                    bVar57 = pbVar88[uVar70];
                  } while (bVar57 != 0);
                }
              }
              if (0 < (int)local_4378) {
                puVar73 = (undefined4 *)0x0;
                do {
                  cVar3 = (char)plVar89[2];
                  iVar69 = (uint)(cVar3 != '\0') * 2 <<
                           ((byte)(((dec->header[1] >> 3 & 1) + ((dec->header[1] >> 4 & 1) != 0)) *
                                   '\x03' + (dec->header[2] >> 2 & 3)) == '\x02');
                  if (*(char *)((long)plVar89 + 0x12) == '\0') {
                    pfVar63 = local_3420 + (long)puVar73 * 0x240;
                    iVar44 = 0x1f;
                    pfVar77 = pfVar63;
LAB_00105b07:
                    do {
                      lVar52 = 0;
                      bVar91 = true;
                      do {
                        bVar75 = bVar91;
                        pfVar66 = pfVar63 + lVar52 + 0x12;
                        fVar92 = *pfVar66;
                        fVar95 = pfVar66[1];
                        fVar96 = pfVar66[2];
                        fVar31 = pfVar66[3];
                        fVar32 = pfVar63[0xe - lVar52];
                        fVar33 = pfVar63[0xf - lVar52];
                        fVar34 = pfVar63[0x10 - lVar52];
                        fVar35 = pfVar63[0x11 - lVar52];
                        auVar94 = *(undefined1 (*) [16])(drmp3_L3_antialias_g_aa + lVar52 * 4);
                        lVar61 = lVar52 * 4;
                        fVar36 = *(float *)(drmp3_L3_antialias_g_aa + lVar61 + 0x20);
                        fVar37 = *(float *)(drmp3_L3_antialias_g_aa + lVar61 + 0x24);
                        fVar38 = *(float *)(drmp3_L3_antialias_g_aa + lVar61 + 0x28);
                        fVar39 = *(float *)(drmp3_L3_antialias_g_aa + lVar61 + 0x2c);
                        pfVar66 = pfVar63 + lVar52 + 0x12;
                        *pfVar66 = fVar92 * auVar94._0_4_ - fVar35 * fVar36;
                        pfVar66[1] = fVar95 * auVar94._4_4_ - fVar34 * fVar37;
                        pfVar66[2] = fVar96 * auVar94._8_4_ - fVar33 * fVar38;
                        pfVar66[3] = fVar31 * auVar94._12_4_ - fVar32 * fVar39;
                        auVar103._4_4_ = fVar33 * auVar94._8_4_ + fVar96 * fVar38;
                        auVar103._0_4_ = fVar32 * auVar94._12_4_ + fVar31 * fVar39;
                        auVar103._8_4_ = fVar34 * auVar94._4_4_ + fVar95 * fVar37;
                        auVar103._12_4_ = fVar35 * auVar94._0_4_ + fVar92 * fVar36;
                        *(undefined1 (*) [16])(pfVar63 + (0xe - lVar52)) = auVar103;
                        lVar52 = 4;
                        bVar91 = false;
                      } while (bVar75);
                      bVar91 = 1 < iVar44;
                      pfVar63 = pfVar63 + 0x12;
                      iVar44 = iVar44 + -1;
                    } while (bVar91);
                    overlap = dec->mdct_overlap + (long)puVar73;
                    cVar64 = *(char *)((long)plVar89 + 0xf);
                    pfVar63 = pfVar77;
                    if (cVar3 == '\0') goto LAB_00105c38;
                    drmp3_L3_imdct36(pfVar77,*overlap,(float *)drmp3_L3_imdct_gr_g_mdct_window,
                                     iVar69);
                    pfVar77 = (float *)((long)local_3420 +
                                       (ulong)(uint)(iVar69 * 0x48) + (long)puVar73 * 0x900);
                    overlap = (float (*) [288])((long)*overlap + (ulong)(uint)(iVar69 * 0x24));
                    if (cVar64 == '\x02') goto LAB_00105c40;
LAB_00105bf5:
                    drmp3_L3_imdct36(pfVar77,*overlap,
                                     (float *)(drmp3_L3_imdct_gr_g_mdct_window +
                                              (ulong)(cVar64 == '\x03') * 0x48),0x20 - iVar69);
                  }
                  else {
                    pfVar63 = local_3420 + (long)puVar73 * 0x240;
                    pfVar77 = (float *)((ulong)(uint)(iVar69 * 0x48) + (long)pfVar63);
                    bVar79 = *(byte *)(*plVar89 + (ulong)*(byte *)((long)plVar89 + 0x11));
                    if (bVar79 == 0) {
                      pfVar66 = local_2180;
                    }
                    else {
                      lVar52 = *plVar89 + (ulong)*(byte *)((long)plVar89 + 0x11);
                      pfVar62 = local_2180;
                      pfVar74 = pfVar77;
                      do {
                        pfVar78 = pfVar74 + (ulong)bVar79 * 2;
                        lVar61 = 0;
                        pfVar66 = pfVar62;
                        do {
                          *pfVar62 = pfVar74[lVar61];
                          pfVar62[1] = pfVar74[(ulong)bVar79 + lVar61];
                          pfVar62[2] = *pfVar78;
                          pfVar62 = pfVar62 + 3;
                          pfVar66 = pfVar66 + 3;
                          pfVar78 = pfVar78 + 1;
                          lVar61 = lVar61 + 1;
                        } while ((uint)bVar79 != (uint)lVar61);
                        bVar79 = *(byte *)(lVar52 + 3);
                        lVar52 = lVar52 + 3;
                        pfVar74 = pfVar78;
                      } while (bVar79 != 0);
                    }
                    memcpy(pfVar77,local_2180,(long)pfVar66 - (long)local_2180);
                    if (cVar3 != '\0') {
                      iVar44 = iVar69 + -1;
                      pfVar77 = pfVar63;
                      goto LAB_00105b07;
                    }
                    overlap = dec->mdct_overlap + (long)puVar73;
                    cVar64 = *(char *)((long)plVar89 + 0xf);
LAB_00105c38:
                    pfVar77 = pfVar63;
                    if (cVar64 != '\x02') goto LAB_00105bf5;
LAB_00105c40:
                    uVar59 = 0x21 - iVar69;
                    lVar52 = 0;
                    do {
                      pfVar66 = (float *)((long)pfVar77 + lVar52 * 2);
                      pfVar62 = pfVar66;
                      pfVar74 = (float *)&local_4338;
                      for (lVar61 = 0x12; lVar61 != 0; lVar61 = lVar61 + -1) {
                        *pfVar74 = *pfVar62;
                        pfVar62 = pfVar62 + (ulong)bVar42 * -2 + 1;
                        pfVar74 = pfVar74 + (ulong)bVar42 * -2 + 1;
                      }
                      pfVar62 = (float *)((long)*overlap + lVar52 + 0x18);
                      *(undefined8 *)(pfVar66 + 4) = *(undefined8 *)(pfVar62 + -2);
                      uVar56 = *(undefined8 *)(pfVar62 + -4);
                      *(undefined8 *)pfVar66 = *(undefined8 *)(pfVar62 + -6);
                      *(undefined8 *)(pfVar66 + 2) = uVar56;
                      drmp3_L3_imdct12((float *)&local_4338,
                                       (float *)((long)pfVar77 + lVar52 * 2 + 0x18),pfVar62);
                      drmp3_L3_imdct12(&fStack_4334,(float *)((long)pfVar77 + lVar52 * 2 + 0x30),
                                       pfVar62);
                      drmp3_L3_imdct12((float *)&local_4330,(float *)((long)*overlap + lVar52),
                                       pfVar62);
                      uVar59 = uVar59 - 1;
                      lVar52 = lVar52 + 0x24;
                    } while (1 < uVar59);
                  }
                  pfVar63 = pfVar63 + 0x13;
                  uVar59 = 0;
                  do {
                    uVar70 = 0xffffffffffffffff;
                    do {
                      pfVar63[uVar70 + 1] = (float)((uint)pfVar63[uVar70 + 1] ^ (uint)DAT_00112090);
                      uVar70 = uVar70 + 2;
                    } while (uVar70 < 0x10);
                    pfVar63 = pfVar63 + 0x24;
                    bVar91 = uVar59 < 0x1e;
                    uVar59 = uVar59 + 2;
                  } while (bVar91);
                  puVar73 = (undefined4 *)((long)puVar73 + 1);
                  plVar89 = plVar89 + 4;
                } while ((float *)puVar73 != local_4358);
              }
              pdVar41 = local_4360;
              pdVar40 = local_4368;
              drmp3d_synth_granule
                        (local_4348,local_3420,0x12,local_4360->channels,local_4368,local_2180);
              uVar70 = (ulong)pdVar41->channels;
              local_4368 = pdVar40 + uVar70 * 0x240;
              iVar69 = 1;
              uVar56 = 0;
            } while (((byte)local_434c & (local_4388[1] & 8) >> 3) != 0);
            uVar80 = local_3fb0.pos + 7U >> 3;
          }
          uVar65 = ((uint)local_3fb0.limit >> 3) - uVar80;
          uVar59 = 0x1ff;
          if ((int)uVar65 < 0x1ff) {
            uVar59 = uVar65;
          }
          if (0 < (int)uVar65) {
            if (0x1ff < uVar65) {
              uVar80 = ((uint)local_3fb0.limit >> 3) - 0x1ff;
            }
            memcpy(dec->reserv_buf,local_3fa0 + uVar80,(ulong)uVar59);
          }
          uVar43 = (uint)((int)uVar49 <= (int)uVar43);
          dec->reserv = uVar59;
        }
        else {
          if (local_4368 == (drmp3d_sample_t *)0x0) {
            if ((~bVar79 & 6) != 0) {
              return 0x480 >> ((bVar79 & 0xe) == 2);
            }
            return 0x180;
          }
          bVar42 = puVar53[3] >> 6;
          if (bVar42 == 3) {
            uVar43 = 0;
          }
          else if (bVar42 == 1) {
            uVar43 = (puVar53[3] >> 2 & 0xc) + 4;
          }
          else {
            uVar43 = 0x20;
          }
          if ((~bVar79 & 6) == 0) {
            puVar72 = &drmp3_L12_subband_alloc_table_g_alloc_L1;
            uVar49 = 0x20;
          }
          else if ((bVar79 & 8) == 0) {
            puVar72 = &drmp3_L12_subband_alloc_table_g_alloc_L2M2;
            uVar49 = 0x1e;
          }
          else {
            bVar90 = puVar53[2] >> 2 & 3;
            bVar58 = *(byte *)((ulong)(puVar53[2] >> 4) +
                              (long)(int)((bVar79 >> 1 & 3) - 1) * 0xf + 0x1125fd);
            uVar59 = 0xc0;
            if (bVar58 != 0) {
              uVar59 = (uint)bVar58 + (uint)bVar58 >> (bVar42 != 3);
            }
            if (uVar59 < 0x38) {
              uVar49 = (uint)(bVar90 == 2) * 4 + 8;
              puVar72 = (undefined1 *)&drmp3_L12_subband_alloc_table_g_alloc_L2M1_lowrate;
            }
            else {
              uVar49 = 0x1b;
              if (bVar90 != 1) {
                uVar49 = (uint)(0x5f < uVar59) * 3 + 0x1b;
              }
              puVar72 = drmp3_L12_subband_alloc_table_g_alloc_L2M1;
            }
          }
          local_4038 = (byte)uVar49;
          uVar59 = uVar49;
          if (uVar43 < uVar49) {
            uVar59 = uVar43;
          }
          uVar70 = (ulong)uVar59;
          local_4037 = (byte)uVar59;
          uVar81 = 0;
          puVar68 = drmp3_L12_read_scale_info_g_bitalloc_code_tab;
          uVar59 = 0;
          uVar80 = 0;
          do {
            if (uVar81 == uVar80) {
              uVar80 = uVar80 + (byte)puVar72[2];
              uVar59 = (uint)(byte)puVar72[1];
              puVar68 = drmp3_L12_read_scale_info_g_bitalloc_code_tab + (byte)*puVar72;
              puVar72 = puVar72 + 3;
            }
            dVar50 = drmp3_bs_get_bits(&local_4398,uVar59);
            bVar42 = puVar68[dVar50];
            local_4036[uVar81 * 2] = bVar42;
            if (uVar81 < uVar70) {
              dVar50 = drmp3_bs_get_bits(&local_4398,uVar59);
              bVar42 = puVar68[dVar50];
            }
            if (uVar43 == 0) {
              bVar42 = 0;
            }
            local_4036[uVar81 * 2 + 1] = bVar42;
            uVar81 = uVar81 + 1;
          } while (uVar49 != uVar81);
          uVar81 = 0;
          pbVar88 = local_4036;
          do {
            bVar42 = (local_4036[uVar81] == 0) << 2 | 2;
            if ((local_4036[uVar81] != 0) && ((bVar79 & 6) != 6)) {
              dVar50 = drmp3_bs_get_bits(&local_4398,2);
              bVar42 = (byte)dVar50;
            }
            abStack_3ff6[uVar81] = bVar42;
            uVar81 = uVar81 + 1;
          } while (uVar49 * 2 != uVar81);
          pfVar63 = (float *)&local_4338;
          local_43f8 = 0;
          do {
            bVar42 = *pbVar88;
            uVar59 = 0;
            if (bVar42 != 0) {
              uVar59 = 0x13U >> (abStack_3ff6[local_43f8] & 0x1f) | 4;
            }
            pbVar88 = pbVar88 + 1;
            fVar92 = 0.0;
            uVar80 = 4;
            do {
              if ((uVar80 & uVar59) != 0) {
                dVar50 = drmp3_bs_get_bits(&local_4398,6);
                fVar92 = (float)(int)(0x200000 >> ((byte)((int)dVar50 / 3) & 0x1f)) *
                         *(float *)(drmp3_L12_read_scalefactors_g_deq_L12 +
                                   (long)(int)((int)dVar50 % 3 +
                                              (uint)bVar42 + (uint)bVar42 * 2 + -6) * 4);
              }
              *pfVar63 = fVar92;
              pfVar63 = pfVar63 + 1;
              bVar91 = 1 < uVar80;
              uVar80 = uVar80 >> 1;
            } while (bVar91);
            local_43f8 = local_43f8 + 1;
          } while (local_43f8 != uVar49 * 2);
          if (uVar43 < uVar49) {
            lVar61 = uVar49 - uVar70;
            lVar52 = lVar61 + -1;
            auVar94._8_4_ = (int)lVar52;
            auVar94._0_8_ = lVar52;
            auVar94._12_4_ = (int)((ulong)lVar52 >> 0x20);
            lVar52 = uVar70 * 2;
            uVar70 = 0;
            do {
              auVar125._8_4_ = (int)uVar70;
              auVar125._0_8_ = uVar70;
              auVar125._12_4_ = (int)(uVar70 >> 0x20);
              auVar127 = auVar94 ^ _DAT_00112090;
              auVar129 = (auVar125 | _DAT_00112080) ^ _DAT_00112090;
              iVar69 = auVar127._0_4_;
              iVar47 = -(uint)(iVar69 < auVar129._0_4_);
              iVar44 = auVar127._4_4_;
              auVar131._4_4_ = -(uint)(iVar44 < auVar129._4_4_);
              iVar45 = auVar127._8_4_;
              iVar46 = -(uint)(iVar45 < auVar129._8_4_);
              iVar87 = auVar127._12_4_;
              auVar131._12_4_ = -(uint)(iVar87 < auVar129._12_4_);
              auVar104._4_4_ = iVar47;
              auVar104._0_4_ = iVar47;
              auVar104._8_4_ = iVar46;
              auVar104._12_4_ = iVar46;
              auVar104 = pshuflw(in_XMM1,auVar104,0xe8);
              auVar130._4_4_ = -(uint)(auVar129._4_4_ == iVar44);
              auVar130._12_4_ = -(uint)(auVar129._12_4_ == iVar87);
              auVar130._0_4_ = auVar130._4_4_;
              auVar130._8_4_ = auVar130._12_4_;
              auVar115 = pshuflw(in_XMM2,auVar130,0xe8);
              auVar131._0_4_ = auVar131._4_4_;
              auVar131._8_4_ = auVar131._12_4_;
              auVar129 = pshuflw(auVar104,auVar131,0xe8);
              auVar127._8_4_ = 0xffffffff;
              auVar127._0_8_ = 0xffffffffffffffff;
              auVar127._12_4_ = 0xffffffff;
              auVar127 = (auVar129 | auVar115 & auVar104) ^ auVar127;
              auVar127 = packssdw(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                local_4036[uVar70 * 2 + lVar52 + 1] = 0;
              }
              auVar115._4_4_ = iVar47;
              auVar115._0_4_ = iVar47;
              auVar115._8_4_ = iVar46;
              auVar115._12_4_ = iVar46;
              auVar131 = auVar130 & auVar115 | auVar131;
              auVar127 = packssdw(auVar131,auVar131);
              auVar129._8_4_ = 0xffffffff;
              auVar129._0_8_ = 0xffffffffffffffff;
              auVar129._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 ^ auVar129,auVar127 ^ auVar129);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._0_4_ >> 8 & 1) != 0) {
                local_4036[uVar70 * 2 + lVar52 + 3] = 0;
              }
              auVar127 = (auVar125 | _DAT_00112070) ^ _DAT_00112090;
              auVar116._0_4_ = -(uint)(iVar69 < auVar127._0_4_);
              auVar116._4_4_ = -(uint)(iVar44 < auVar127._4_4_);
              auVar116._8_4_ = -(uint)(iVar45 < auVar127._8_4_);
              auVar116._12_4_ = -(uint)(iVar87 < auVar127._12_4_);
              auVar132._4_4_ = auVar116._0_4_;
              auVar132._0_4_ = auVar116._0_4_;
              auVar132._8_4_ = auVar116._8_4_;
              auVar132._12_4_ = auVar116._8_4_;
              iVar47 = -(uint)(auVar127._4_4_ == iVar44);
              iVar46 = -(uint)(auVar127._12_4_ == iVar87);
              auVar19._4_4_ = iVar47;
              auVar19._0_4_ = iVar47;
              auVar19._8_4_ = iVar46;
              auVar19._12_4_ = iVar46;
              auVar142._4_4_ = auVar116._4_4_;
              auVar142._0_4_ = auVar116._4_4_;
              auVar142._8_4_ = auVar116._12_4_;
              auVar142._12_4_ = auVar116._12_4_;
              auVar127 = auVar19 & auVar132 | auVar142;
              auVar127 = packssdw(auVar127,auVar127);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 ^ auVar10,auVar127 ^ auVar10);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._0_4_ >> 0x10 & 1) != 0) {
                local_4036[uVar70 * 2 + lVar52 + 5] = 0;
              }
              auVar127 = pshufhw(auVar127,auVar132,0x84);
              auVar20._4_4_ = iVar47;
              auVar20._0_4_ = iVar47;
              auVar20._8_4_ = iVar46;
              auVar20._12_4_ = iVar46;
              auVar129 = pshufhw(auVar116,auVar20,0x84);
              auVar104 = pshufhw(auVar127,auVar142,0x84);
              auVar105._8_4_ = 0xffffffff;
              auVar105._0_8_ = 0xffffffffffffffff;
              auVar105._12_4_ = 0xffffffff;
              auVar105 = (auVar104 | auVar129 & auVar127) ^ auVar105;
              auVar127 = packssdw(auVar105,auVar105);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._0_4_ >> 0x18 & 1) != 0) {
                local_4036[uVar70 * 2 + lVar52 + 7] = 0;
              }
              auVar127 = (auVar125 | _DAT_00112060) ^ _DAT_00112090;
              auVar117._0_4_ = -(uint)(iVar69 < auVar127._0_4_);
              auVar117._4_4_ = -(uint)(iVar44 < auVar127._4_4_);
              auVar117._8_4_ = -(uint)(iVar45 < auVar127._8_4_);
              auVar117._12_4_ = -(uint)(iVar87 < auVar127._12_4_);
              auVar21._4_4_ = auVar117._0_4_;
              auVar21._0_4_ = auVar117._0_4_;
              auVar21._8_4_ = auVar117._8_4_;
              auVar21._12_4_ = auVar117._8_4_;
              auVar129 = pshuflw(auVar142,auVar21,0xe8);
              auVar106._0_4_ = -(uint)(auVar127._0_4_ == iVar69);
              auVar106._4_4_ = -(uint)(auVar127._4_4_ == iVar44);
              auVar106._8_4_ = -(uint)(auVar127._8_4_ == iVar45);
              auVar106._12_4_ = -(uint)(auVar127._12_4_ == iVar87);
              auVar133._4_4_ = auVar106._4_4_;
              auVar133._0_4_ = auVar106._4_4_;
              auVar133._8_4_ = auVar106._12_4_;
              auVar133._12_4_ = auVar106._12_4_;
              auVar127 = pshuflw(auVar106,auVar133,0xe8);
              auVar134._4_4_ = auVar117._4_4_;
              auVar134._0_4_ = auVar117._4_4_;
              auVar134._8_4_ = auVar117._12_4_;
              auVar134._12_4_ = auVar117._12_4_;
              auVar104 = pshuflw(auVar117,auVar134,0xe8);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 & auVar129,(auVar104 | auVar127 & auVar129) ^ auVar11);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                local_4036[uVar70 * 2 + lVar52 + 9] = 0;
              }
              auVar22._4_4_ = auVar117._0_4_;
              auVar22._0_4_ = auVar117._0_4_;
              auVar22._8_4_ = auVar117._8_4_;
              auVar22._12_4_ = auVar117._8_4_;
              auVar134 = auVar133 & auVar22 | auVar134;
              auVar104 = packssdw(auVar134,auVar134);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127,auVar104 ^ auVar12);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._4_2_ >> 8 & 1) != 0) {
                local_4036[uVar70 * 2 + lVar52 + 0xb] = 0;
              }
              auVar127 = (auVar125 | _DAT_00112050) ^ _DAT_00112090;
              auVar118._0_4_ = -(uint)(iVar69 < auVar127._0_4_);
              auVar118._4_4_ = -(uint)(iVar44 < auVar127._4_4_);
              auVar118._8_4_ = -(uint)(iVar45 < auVar127._8_4_);
              auVar118._12_4_ = -(uint)(iVar87 < auVar127._12_4_);
              auVar135._4_4_ = auVar118._0_4_;
              auVar135._0_4_ = auVar118._0_4_;
              auVar135._8_4_ = auVar118._8_4_;
              auVar135._12_4_ = auVar118._8_4_;
              iVar47 = -(uint)(auVar127._4_4_ == iVar44);
              iVar46 = -(uint)(auVar127._12_4_ == iVar87);
              auVar23._4_4_ = iVar47;
              auVar23._0_4_ = iVar47;
              auVar23._8_4_ = iVar46;
              auVar23._12_4_ = iVar46;
              auVar143._4_4_ = auVar118._4_4_;
              auVar143._0_4_ = auVar118._4_4_;
              auVar143._8_4_ = auVar118._12_4_;
              auVar143._12_4_ = auVar118._12_4_;
              auVar127 = auVar23 & auVar135 | auVar143;
              auVar127 = packssdw(auVar127,auVar127);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 ^ auVar13,auVar127 ^ auVar13);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                local_4036[uVar70 * 2 + lVar52 + 0xd] = 0;
              }
              auVar127 = pshufhw(auVar127,auVar135,0x84);
              auVar24._4_4_ = iVar47;
              auVar24._0_4_ = iVar47;
              auVar24._8_4_ = iVar46;
              auVar24._12_4_ = iVar46;
              auVar129 = pshufhw(auVar118,auVar24,0x84);
              auVar104 = pshufhw(auVar127,auVar143,0x84);
              auVar107._8_4_ = 0xffffffff;
              auVar107._0_8_ = 0xffffffffffffffff;
              auVar107._12_4_ = 0xffffffff;
              auVar107 = (auVar104 | auVar129 & auVar127) ^ auVar107;
              auVar127 = packssdw(auVar107,auVar107);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._6_2_ >> 8 & 1) != 0) {
                local_4036[uVar70 * 2 + lVar52 + 0xf] = 0;
              }
              auVar127 = (auVar125 | _DAT_00112040) ^ _DAT_00112090;
              auVar119._0_4_ = -(uint)(iVar69 < auVar127._0_4_);
              auVar119._4_4_ = -(uint)(iVar44 < auVar127._4_4_);
              auVar119._8_4_ = -(uint)(iVar45 < auVar127._8_4_);
              auVar119._12_4_ = -(uint)(iVar87 < auVar127._12_4_);
              auVar25._4_4_ = auVar119._0_4_;
              auVar25._0_4_ = auVar119._0_4_;
              auVar25._8_4_ = auVar119._8_4_;
              auVar25._12_4_ = auVar119._8_4_;
              auVar129 = pshuflw(auVar143,auVar25,0xe8);
              auVar108._0_4_ = -(uint)(auVar127._0_4_ == iVar69);
              auVar108._4_4_ = -(uint)(auVar127._4_4_ == iVar44);
              auVar108._8_4_ = -(uint)(auVar127._8_4_ == iVar45);
              auVar108._12_4_ = -(uint)(auVar127._12_4_ == iVar87);
              auVar136._4_4_ = auVar108._4_4_;
              auVar136._0_4_ = auVar108._4_4_;
              auVar136._8_4_ = auVar108._12_4_;
              auVar136._12_4_ = auVar108._12_4_;
              auVar127 = pshuflw(auVar108,auVar136,0xe8);
              auVar137._4_4_ = auVar119._4_4_;
              auVar137._0_4_ = auVar119._4_4_;
              auVar137._8_4_ = auVar119._12_4_;
              auVar137._12_4_ = auVar119._12_4_;
              auVar104 = pshuflw(auVar119,auVar137,0xe8);
              auVar120._8_4_ = 0xffffffff;
              auVar120._0_8_ = 0xffffffffffffffff;
              auVar120._12_4_ = 0xffffffff;
              auVar120 = (auVar104 | auVar127 & auVar129) ^ auVar120;
              auVar104 = packssdw(auVar120,auVar120);
              auVar127 = packsswb(auVar127 & auVar129,auVar104);
              if ((auVar127 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                local_4036[uVar70 * 2 + lVar52 + 0x11] = 0;
              }
              auVar26._4_4_ = auVar119._0_4_;
              auVar26._0_4_ = auVar119._0_4_;
              auVar26._8_4_ = auVar119._8_4_;
              auVar26._12_4_ = auVar119._8_4_;
              auVar137 = auVar136 & auVar26 | auVar137;
              auVar104 = packssdw(auVar137,auVar137);
              auVar14._8_4_ = 0xffffffff;
              auVar14._0_8_ = 0xffffffffffffffff;
              auVar14._12_4_ = 0xffffffff;
              auVar104 = packssdw(auVar104 ^ auVar14,auVar104 ^ auVar14);
              auVar127 = packsswb(auVar127,auVar104);
              if ((auVar127._8_2_ >> 8 & 1) != 0) {
                local_4036[uVar70 * 2 + lVar52 + 0x13] = 0;
              }
              auVar127 = (auVar125 | _DAT_00112030) ^ _DAT_00112090;
              auVar121._0_4_ = -(uint)(iVar69 < auVar127._0_4_);
              auVar121._4_4_ = -(uint)(iVar44 < auVar127._4_4_);
              auVar121._8_4_ = -(uint)(iVar45 < auVar127._8_4_);
              auVar121._12_4_ = -(uint)(iVar87 < auVar127._12_4_);
              auVar138._4_4_ = auVar121._0_4_;
              auVar138._0_4_ = auVar121._0_4_;
              auVar138._8_4_ = auVar121._8_4_;
              auVar138._12_4_ = auVar121._8_4_;
              iVar47 = -(uint)(auVar127._4_4_ == iVar44);
              iVar46 = -(uint)(auVar127._12_4_ == iVar87);
              auVar27._4_4_ = iVar47;
              auVar27._0_4_ = iVar47;
              auVar27._8_4_ = iVar46;
              auVar27._12_4_ = iVar46;
              auVar144._4_4_ = auVar121._4_4_;
              auVar144._0_4_ = auVar121._4_4_;
              auVar144._8_4_ = auVar121._12_4_;
              auVar144._12_4_ = auVar121._12_4_;
              auVar127 = auVar27 & auVar138 | auVar144;
              auVar127 = packssdw(auVar127,auVar127);
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 ^ auVar15,auVar127 ^ auVar15);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                local_4036[uVar70 * 2 + lVar52 + 0x15] = 0;
              }
              auVar127 = pshufhw(auVar127,auVar138,0x84);
              auVar28._4_4_ = iVar47;
              auVar28._0_4_ = iVar47;
              auVar28._8_4_ = iVar46;
              auVar28._12_4_ = iVar46;
              auVar129 = pshufhw(auVar121,auVar28,0x84);
              auVar104 = pshufhw(auVar127,auVar144,0x84);
              auVar109._8_4_ = 0xffffffff;
              auVar109._0_8_ = 0xffffffffffffffff;
              auVar109._12_4_ = 0xffffffff;
              auVar109 = (auVar104 | auVar129 & auVar127) ^ auVar109;
              auVar127 = packssdw(auVar109,auVar109);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._10_2_ >> 8 & 1) != 0) {
                local_4036[uVar70 * 2 + lVar52 + 0x17] = 0;
              }
              auVar127 = (auVar125 | _DAT_00112020) ^ _DAT_00112090;
              auVar122._0_4_ = -(uint)(iVar69 < auVar127._0_4_);
              auVar122._4_4_ = -(uint)(iVar44 < auVar127._4_4_);
              auVar122._8_4_ = -(uint)(iVar45 < auVar127._8_4_);
              auVar122._12_4_ = -(uint)(iVar87 < auVar127._12_4_);
              auVar29._4_4_ = auVar122._0_4_;
              auVar29._0_4_ = auVar122._0_4_;
              auVar29._8_4_ = auVar122._8_4_;
              auVar29._12_4_ = auVar122._8_4_;
              auVar129 = pshuflw(auVar144,auVar29,0xe8);
              auVar110._0_4_ = -(uint)(auVar127._0_4_ == iVar69);
              auVar110._4_4_ = -(uint)(auVar127._4_4_ == iVar44);
              auVar110._8_4_ = -(uint)(auVar127._8_4_ == iVar45);
              auVar110._12_4_ = -(uint)(auVar127._12_4_ == iVar87);
              auVar139._4_4_ = auVar110._4_4_;
              auVar139._0_4_ = auVar110._4_4_;
              auVar139._8_4_ = auVar110._12_4_;
              auVar139._12_4_ = auVar110._12_4_;
              auVar127 = pshuflw(auVar110,auVar139,0xe8);
              auVar140._4_4_ = auVar122._4_4_;
              auVar140._0_4_ = auVar122._4_4_;
              auVar140._8_4_ = auVar122._12_4_;
              auVar140._12_4_ = auVar122._12_4_;
              auVar104 = pshuflw(auVar122,auVar140,0xe8);
              auVar16._8_4_ = 0xffffffff;
              auVar16._0_8_ = 0xffffffffffffffff;
              auVar16._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 & auVar129,(auVar104 | auVar127 & auVar129) ^ auVar16);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                local_4036[uVar70 * 2 + lVar52 + 0x19] = 0;
              }
              auVar30._4_4_ = auVar122._0_4_;
              auVar30._0_4_ = auVar122._0_4_;
              auVar30._8_4_ = auVar122._8_4_;
              auVar30._12_4_ = auVar122._8_4_;
              auVar140 = auVar139 & auVar30 | auVar140;
              auVar104 = packssdw(auVar140,auVar140);
              auVar17._8_4_ = 0xffffffff;
              auVar17._0_8_ = 0xffffffffffffffff;
              auVar17._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127,auVar104 ^ auVar17);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._12_2_ >> 8 & 1) != 0) {
                local_4036[uVar70 * 2 + lVar52 + 0x1b] = 0;
              }
              auVar127 = (auVar125 | _DAT_00112010) ^ _DAT_00112090;
              auVar111._0_4_ = -(uint)(iVar69 < auVar127._0_4_);
              auVar111._4_4_ = -(uint)(iVar44 < auVar127._4_4_);
              auVar111._8_4_ = -(uint)(iVar45 < auVar127._8_4_);
              auVar111._12_4_ = -(uint)(iVar87 < auVar127._12_4_);
              auVar141._4_4_ = auVar111._0_4_;
              auVar141._0_4_ = auVar111._0_4_;
              auVar141._8_4_ = auVar111._8_4_;
              auVar141._12_4_ = auVar111._8_4_;
              auVar126._4_4_ = -(uint)(auVar127._4_4_ == iVar44);
              auVar126._12_4_ = -(uint)(auVar127._12_4_ == iVar87);
              auVar126._0_4_ = auVar126._4_4_;
              auVar126._8_4_ = auVar126._12_4_;
              auVar128._4_4_ = auVar111._4_4_;
              auVar128._0_4_ = auVar111._4_4_;
              auVar128._8_4_ = auVar111._12_4_;
              auVar128._12_4_ = auVar111._12_4_;
              auVar104 = auVar126 & auVar141 | auVar128;
              auVar127 = packssdw(auVar111,auVar104);
              auVar18._8_4_ = 0xffffffff;
              auVar18._0_8_ = 0xffffffffffffffff;
              auVar18._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 ^ auVar18,auVar127 ^ auVar18);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                local_4036[uVar70 * 2 + lVar52 + 0x1d] = 0;
              }
              auVar127 = pshufhw(auVar127,auVar141,0x84);
              in_XMM2 = pshufhw(auVar104,auVar126,0x84);
              in_XMM2 = in_XMM2 & auVar127;
              auVar127 = pshufhw(auVar127,auVar128,0x84);
              auVar112._8_4_ = 0xffffffff;
              auVar112._0_8_ = 0xffffffffffffffff;
              auVar112._12_4_ = 0xffffffff;
              auVar112 = (auVar127 | in_XMM2) ^ auVar112;
              auVar127 = packssdw(auVar112,auVar112);
              in_XMM1 = packsswb(auVar127,auVar127);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                local_4036[uVar70 * 2 + lVar52 + 0x1f] = 0;
              }
              uVar70 = uVar70 + 0x10;
            } while ((lVar61 + 0xfU & 0xfffffffffffffff0) != uVar70);
          }
          lVar52 = 0;
          memset(local_3420,0,0x1200);
          local_4358 = dec->qmf_state;
          iVar69 = 0;
          uVar70 = local_4378;
          do {
            bVar42 = local_4038;
            uVar43 = local_4360->layer;
            uVar81 = (ulong)local_4038;
            uVar59 = (uint)local_4038;
            local_4370 = (long)(int)uVar43 | 1;
            uVar86 = (ulong)uVar43 | 1;
            iVar44 = 0x240;
            lVar61 = 0;
            local_4378 = uVar70;
            bVar79 = local_4038;
            do {
              if (bVar79 == 0) {
                bVar79 = 0;
              }
              else {
                pfVar63 = local_3420 + (long)iVar69 + lVar61 * local_4370;
                lVar54 = 0;
                do {
                  bVar79 = local_4036[lVar54];
                  if (bVar79 != 0) {
                    if (bVar79 < 0x11) {
                      if (-1 < (int)uVar43) {
                        uVar70 = 0;
                        do {
                          dVar50 = drmp3_bs_get_bits(&local_4398,(uint)bVar79);
                          pfVar63[uVar70] = (float)(int)(dVar50 + (-1 << (bVar79 - 1 & 0x1f)) + 1);
                          uVar70 = uVar70 + 1;
                        } while (uVar86 != uVar70);
                      }
                    }
                    else {
                      uVar49 = 2 << (bVar79 - 0x11 & 0x1f);
                      dVar50 = drmp3_bs_get_bits(&local_4398,(uVar49 - (uVar49 >> 3)) + 3);
                      if (-1 < (int)uVar43) {
                        uVar70 = 0;
                        do {
                          pfVar63[uVar70] = (float)(int)(dVar50 % (uVar49 + 1) - (uVar49 >> 1));
                          uVar70 = uVar70 + 1;
                          dVar50 = dVar50 / (uVar49 + 1);
                        } while (uVar86 != uVar70);
                      }
                    }
                  }
                  pfVar63 = pfVar63 + iVar44;
                  iVar44 = 0x12 - iVar44;
                  lVar54 = lVar54 + 1;
                  uVar70 = local_4378;
                  bVar79 = bVar42;
                } while (lVar54 != (ulong)(uVar59 * 2) + (ulong)((ulong)(uVar59 * 2) == 0));
              }
              lVar61 = lVar61 + 1;
            } while (lVar61 != 4);
            iVar69 = iVar69 + (int)uVar86 * 4;
            if (iVar69 == 0xc) {
              memcpy(local_2b20 + (uint)local_4037 * 0x48,
                     (void *)((ulong)((uint)local_4037 * 0x48) + (long)local_3420),
                     (uVar81 - local_4037) * 0x48);
              pdVar40 = local_4368;
              if (bVar42 != 0) {
                pfVar77 = (float *)(&local_4338 + lVar52);
                uVar43 = 0;
                pfVar63 = local_3420;
                do {
                  fVar92 = *pfVar77;
                  fVar95 = pfVar77[3];
                  lVar61 = 0;
                  do {
                    pfVar66 = pfVar63 + lVar61;
                    fVar96 = pfVar66[1];
                    fVar31 = pfVar66[2];
                    fVar32 = pfVar66[3];
                    pfVar62 = pfVar63 + lVar61;
                    *pfVar62 = *pfVar66 * fVar92;
                    pfVar62[1] = fVar96 * fVar92;
                    pfVar62[2] = fVar31 * fVar92;
                    pfVar62[3] = fVar32 * fVar92;
                    pfVar66 = pfVar63 + lVar61 + 0x240;
                    auVar123._0_4_ = *pfVar66 * fVar95;
                    auVar123._4_4_ = pfVar66[1] * fVar95;
                    auVar123._8_4_ = pfVar66[2] * fVar95;
                    auVar123._12_4_ = pfVar66[3] * fVar95;
                    *(undefined1 (*) [16])(pfVar63 + lVar61 + 0x240) = auVar123;
                    lVar61 = lVar61 + 4;
                  } while (lVar61 != 0xc);
                  uVar43 = uVar43 + 1;
                  pfVar63 = pfVar63 + 0x12;
                  pfVar77 = pfVar77 + 6;
                } while (uVar43 != bVar42);
              }
              drmp3d_synth_granule(local_4358,local_3420,0xc,(int)local_4378,local_4368,local_2180);
              iVar69 = 0;
              memset(local_3420,0,0x1200);
              uVar70 = (ulong)local_4360->channels;
              local_4368 = pdVar40 + uVar70 * 0x180;
            }
            if (local_4398.limit < local_4398.pos) goto LAB_00104b77;
            lVar52 = lVar52 + 1;
          } while (lVar52 != 3);
          uVar43 = 1;
        }
        uVar59 = 0x180;
        if ((~dec->header[1] & 6) != 0) {
          uVar59 = 0x480 >> ((dec->header[1] & 0xe) == 2);
        }
        return uVar59 * uVar43;
      }
    }
    puVar53 = local_4388;
    memset(dec,0,0x1a0c);
    uVar43 = mp3_bytes - 4;
    iVar69 = 8;
    uVar70 = 0;
    local_4370 = (ulong)(uint)mp3_bytes;
    do {
      iVar44 = drmp3_hdr_valid(puVar53);
      if (iVar44 != 0) {
        bVar79 = puVar53[1];
        bVar58 = puVar53[2];
        bVar91 = false;
        iVar44 = drmp3_hdr_frame_bytes((drmp3_uint8 *)(ulong)bVar79,(uint)bVar58);
        iVar45 = (uint)((~bVar79 & 6) == 0) * 3 + 1;
        if ((bVar58 & 2) == 0) {
          iVar45 = 0;
        }
        local_43e8 = (undefined1 *)(ulong)(uint)(iVar45 + iVar44);
        uVar59 = iVar45 + iVar44;
        if (iVar44 == 0) {
          uVar81 = 4;
          iVar44 = iVar69;
          do {
            if ((int)uVar43 <= iVar44) goto LAB_001045f5;
            iVar45 = drmp3_hdr_compare(puVar53,puVar53 + uVar81);
            if (iVar45 == 0) {
LAB_00104597:
              iVar87 = 0;
            }
            else {
              iVar45 = 0;
              uVar59 = 0;
              if ((puVar53[2] & 2) != 0) {
                uVar59 = -(uint)((~puVar53[1] & 6) != 0) | 0xfffffffc;
              }
              if ((puVar53[uVar81 + 2] & 2) != 0) {
                iVar45 = (uint)((~puVar53[uVar81 + 1] & 6) == 0) * 3 + 1;
              }
              iVar87 = 0;
              if (mp3_bytes < (int)(iVar44 + iVar45 + uVar59 + 4)) goto LAB_00104597;
              iVar45 = drmp3_hdr_compare(puVar53,puVar53 + uVar81 + (iVar45 + uVar59 + (int)uVar81))
              ;
              if (iVar45 != 0) {
                iVar87 = uVar59 + (int)uVar81;
                dec->free_format_bytes = iVar87;
                local_43e8 = (undefined1 *)(uVar81 & 0xffffffff);
              }
            }
            bVar91 = iVar87 == 0;
            uVar59 = (uint)local_43e8;
            if (0x8fe < uVar81) break;
            uVar81 = uVar81 + 1;
            iVar44 = iVar44 + 2;
          } while (iVar87 == 0);
        }
        local_43e8._0_4_ = uVar59;
        if (!bVar91) {
          iVar44 = (uint)uVar70 + (uint)local_43e8;
          if (iVar44 <= mp3_bytes) {
            lVar52 = local_4370 - uVar70;
            iVar45 = 0;
            iVar87 = 0;
            while( true ) {
              bVar79 = puVar53[(long)iVar87 + 1];
              bVar58 = puVar53[(long)iVar87 + 2];
              iVar46 = drmp3_hdr_frame_bytes((drmp3_uint8 *)(ulong)bVar79,(uint)bVar58);
              iVar47 = (uint)((~bVar79 & 6) == 0) * 3 + 1;
              if ((bVar58 & 2) == 0) {
                iVar47 = 0;
              }
              if (lVar52 < iVar47 + iVar87 + iVar46 + 4) break;
              iVar87 = iVar87 + iVar46 + iVar47;
              iVar47 = drmp3_hdr_compare(puVar53,puVar53 + iVar87);
              if (iVar47 == 0) goto LAB_001045f5;
              iVar45 = iVar45 + -1;
              uVar59 = (uint)uVar70;
              if (iVar45 == -10) goto LAB_0010466a;
            }
            if (iVar45 != 0) goto LAB_00104bd1;
          }
        }
LAB_001045f5:
        if ((uVar70 == 0) && ((uint)local_43e8 == mp3_bytes)) {
          uVar70 = 0;
          local_43e8._0_4_ = mp3_bytes;
LAB_00104bd1:
          iVar44 = (uint)uVar70 + (uint)local_43e8;
          uVar59 = (uint)uVar70;
LAB_0010466a:
          uVar43 = uVar59;
          if (((uint)local_43e8 != 0) && (iVar44 <= mp3_bytes)) goto LAB_001046e3;
          break;
        }
        dec->free_format_bytes = 0;
      }
      uVar70 = uVar70 + 1;
      puVar53 = puVar53 + 1;
      iVar69 = iVar69 + 1;
    } while (uVar70 != uVar43);
  }
  local_4360->frame_bytes = uVar43;
  return 0;
LAB_001055d0:
  local_3fb0.pos = (uint)local_43b8;
  puVar53 = local_4380 + 1;
  if ((float *)puVar53 == local_4358) goto LAB_001055f5;
  goto LAB_00104db0;
}

Assistant:

int drmp3dec_decode_frame(drmp3dec *dec, const unsigned char *mp3, int mp3_bytes, void *pcm, drmp3dec_frame_info *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const drmp3_uint8 *hdr;
    drmp3_bs bs_frame[1];
    drmp3dec_scratch scratch;

    if (mp3_bytes > 4 && dec->header[0] == 0xff && drmp3_hdr_compare(dec->header, mp3))
    {
        frame_size = drmp3_hdr_frame_bytes(mp3, dec->free_format_bytes) + drmp3_hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + DRMP3_HDR_SIZE > mp3_bytes || !drmp3_hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        memset(dec, 0, sizeof(drmp3dec));
        i = drmp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }

    hdr = mp3 + i;
    memcpy(dec->header, hdr, DRMP3_HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->channels = DRMP3_HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = drmp3_hdr_sample_rate_hz(hdr);
    info->layer = 4 - DRMP3_HDR_GET_LAYER(hdr);
    info->bitrate_kbps = drmp3_hdr_bitrate_kbps(hdr);

    drmp3_bs_init(bs_frame, hdr + DRMP3_HDR_SIZE, frame_size - DRMP3_HDR_SIZE);
    if (DRMP3_HDR_IS_CRC(hdr))
    {
        drmp3_bs_get_bits(bs_frame, 16);
    }

    if (info->layer == 3)
    {
        int main_data_begin = drmp3_L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            drmp3dec_init(dec);
            return 0;
        }
        success = drmp3_L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success && pcm != NULL)
        {
            for (igr = 0; igr < (DRMP3_HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm = DRMP3_OFFSET_PTR(pcm, sizeof(drmp3d_sample_t)*576*info->channels))
            {
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                drmp3_L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                drmp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, (drmp3d_sample_t*)pcm, scratch.syn[0]);
            }
        }
        drmp3_L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef DR_MP3_ONLY_MP3
        return 0;
#else
        if (pcm == NULL) {
            return drmp3_hdr_frame_samples(hdr);
        }

        drmp3_L12_scale_info sci[1];
        drmp3_L12_read_scale_info(hdr, bs_frame, sci);

        memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += drmp3_L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                drmp3_L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                drmp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, (drmp3d_sample_t*)pcm, scratch.syn[0]);
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                pcm = DRMP3_OFFSET_PTR(pcm, sizeof(drmp3d_sample_t)*384*info->channels);
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                drmp3dec_init(dec);
                return 0;
            }
        }
#endif
    }

    return success*drmp3_hdr_frame_samples(dec->header);
}